

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void __thiscall
Wrapper<CustomUintFormatter<1,false>,AddrManImpl::Format&>::Unserialize<HashVerifier<DataStream>>
          (Wrapper<CustomUintFormatter<1,false>,AddrManImpl::Format&> *this,
          HashVerifier<DataStream> *s)

{
  long in_FS_OFFSET;
  CustomUintFormatter<1,false> local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CustomUintFormatter<1,false>::Unser<HashVerifier<DataStream>,AddrManImpl::Format>
            (&local_9,s,*(Format **)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream &s) { Formatter().Unser(s, m_object); }